

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err getUInt64ValueNum(econf_file key_file,size_t num,uint64_t *result)

{
  int *piVar1;
  ulonglong uVar2;
  char *local_28;
  char *endptr;
  uint64_t *result_local;
  size_t num_local;
  
  endptr = (char *)result;
  result_local = (uint64_t *)num;
  piVar1 = __errno_location();
  *piVar1 = 0;
  uVar2 = strtoull(key_file.file_entry[(long)result_local].value,&local_28,0);
  *(ulonglong *)endptr = uVar2;
  if (((local_28 != key_file.file_entry[(long)result_local].value) &&
      (piVar1 = __errno_location(), *piVar1 != 0x22)) &&
     ((piVar1 = __errno_location(), *piVar1 == 0 || (*(long *)endptr != 0)))) {
    return ECONF_SUCCESS;
  }
  return ECONF_VALUE_CONVERSION_ERROR;
}

Assistant:

econf_err getUInt64ValueNum(econf_file key_file, size_t num, uint64_t *result) {
  char *endptr;
  errno = 0;
  *result = strtoull(key_file.file_entry[num].value, &endptr, 0);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}